

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Design.cpp
# Opt level: O2

int __thiscall CDesign::GetNumNet(CDesign *this,int iMode,int iValue)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((iValue == 5) || (iValue == 3)) {
    iVar1 = this->m_iNumNet;
  }
  else if (iMode == 0) {
    uVar3 = 0;
    uVar2 = (ulong)(uint)this->m_iNumNet;
    if (this->m_iNumNet < 1) {
      uVar2 = uVar3;
    }
    iVar1 = 0;
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      iVar1 = (iVar1 + 1) - (uint)(((this->m_ppNet[uVar3]->super_CObject).m_iProp & iValue) == 0);
    }
  }
  else {
    if (iMode != 1) {
      __assert_fail("FALSE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/Design.cpp"
                    ,0x489,"int CDesign::GetNumNet(int, int)");
    }
    uVar3 = 0;
    uVar2 = (ulong)(uint)this->m_iNumNet;
    if (this->m_iNumNet < 1) {
      uVar2 = uVar3;
    }
    iVar1 = 0;
    for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
      iVar1 = (iVar1 + 1) - (uint)(((this->m_ppNet[uVar3]->super_CObject).m_iState & iValue) == 0);
    }
  }
  return iVar1;
}

Assistant:

int CDesign::GetNumNet(int iMode, int iValue)
{
	if(iValue==STATE_NET_ANY||iValue==PROP_NET_ANY)	return	m_iNumNet;

	int	iNum	=	0;
	switch(iMode) {
	case GET_MODE_PROP:	//count the nets which has iValue as the property
		for(int i=0;i<m_iNumNet;++i)	if(GetNet(i)->GetProp()&iValue)	++iNum;
		break;
	case GET_MODE_STATE://count the nets which has iValue as the state
		for(int i=0;i<m_iNumNet;++i)	if(GetNet(i)->GetState()&iValue)	++iNum;
		break;
	default:
		assert(FALSE);
		break;
	}

	return	iNum;
}